

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

int32_t __thiscall icu_63::UnifiedCache::addHardRef(UnifiedCache *this,SharedObject *value)

{
  u_atomic_int32_t *puVar1;
  int iVar2;
  
  if (value == (SharedObject *)0x0) {
    return 0;
  }
  LOCK();
  puVar1 = &value->hardRefCount;
  iVar2 = (puVar1->super___atomic_base<int>)._M_i;
  (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (iVar2 != 0) {
    return iVar2 + 1;
  }
  this->fNumValuesInUse = this->fNumValuesInUse + 1;
  return 1;
}

Assistant:

int32_t UnifiedCache::addHardRef(const SharedObject *value) const {
    int refCount = 0;
    if (value) {
        refCount = umtx_atomic_inc(&value->hardRefCount);
        U_ASSERT(refCount >= 1);
        if (refCount == 1) {
            fNumValuesInUse++;
        }
    }
    return refCount;
}